

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::computeDualInfeasInDual(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  pdVar3 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->numTot;
  if (this->numTot < 1) {
    uVar4 = uVar5;
  }
  iVar6 = 0;
  do {
    if (uVar4 == uVar5) {
      *dualInfeasCount = iVar6;
      return;
    }
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] != 0) {
      dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      dVar2 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      if ((dVar1 != -1e+200) || (NAN(dVar1))) {
        if ((dVar2 != 1e+200) || (NAN(dVar2))) goto LAB_00131f1e;
      }
      else if ((dVar2 == 1e+200) && (!NAN(dVar2))) {
        iVar6 = (iVar6 + 1) - (uint)(ABS(pdVar3[uVar5]) < this->dblOption[2]);
      }
      iVar6 = (iVar6 + 1) -
              (uint)(-this->dblOption[2] <
                    (double)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5] * pdVar3[uVar5]);
    }
LAB_00131f1e:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void HModel::computeDualInfeasInDual(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In dual, assuming that boxed variables will be flipped
        if (workLower[i] == -inf || workUpper[i] == inf)
            workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}